

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb.c
# Opt level: O3

MMDB_lookup_result_s *
MMDB_lookup_sockaddr
          (MMDB_lookup_result_s *__return_storage_ptr__,MMDB_s *mmdb,sockaddr *sockaddr,
          int *mmdb_error)

{
  uint16_t uVar1;
  ushort uVar2;
  uint uVar3;
  code *pcVar4;
  code *pcVar5;
  long lVar6;
  uint8_t *puVar7;
  ulong uVar8;
  uint uVar9;
  ushort uVar10;
  int iVar11;
  sa_family_t sVar12;
  ulong uVar13;
  long lVar14;
  char *pcVar15;
  uint8_t mapped_address [16];
  char local_48 [12];
  undefined4 local_3c;
  
  *(undefined8 *)__return_storage_ptr__ = 0;
  (__return_storage_ptr__->entry).mmdb = (MMDB_s *)0x0;
  *(undefined8 *)&(__return_storage_ptr__->entry).offset = 0;
  *(undefined8 *)&__return_storage_ptr__->netmask = 0;
  (__return_storage_ptr__->entry).mmdb = mmdb;
  uVar1 = (mmdb->metadata).ip_version;
  sVar12 = sockaddr->sa_family;
  if (uVar1 == 4) {
    iVar11 = 0xb;
    if (sVar12 == 10) goto LAB_00102e9f;
    pcVar15 = sockaddr->sa_data + 2;
  }
  else if (sVar12 == 10) {
    pcVar15 = sockaddr->sa_data + 6;
    sVar12 = 10;
  }
  else {
    pcVar15 = local_48;
    local_48[8] = '\0';
    local_48[9] = '\0';
    local_48[10] = '\0';
    local_48[0xb] = '\0';
    local_48[0] = '\0';
    local_48[1] = '\0';
    local_48[2] = '\0';
    local_48[3] = '\0';
    local_48[4] = '\0';
    local_48[5] = '\0';
    local_48[6] = '\0';
    local_48[7] = '\0';
    local_3c = *(undefined4 *)(sockaddr->sa_data + 2);
  }
  uVar2 = mmdb->full_record_byte_size;
  iVar11 = 6;
  if ((ushort)(uVar2 - 6) < 3) {
    if (sVar12 == 2 && uVar1 == 6) {
      uVar13 = (ulong)(mmdb->ipv4_start_node).node_value;
      uVar10 = (mmdb->ipv4_start_node).netmask;
    }
    else {
      uVar10 = 0;
      uVar13 = 0;
    }
    uVar3 = (mmdb->metadata).node_count;
    if (uVar13 < uVar3 && uVar10 < mmdb->depth) {
      uVar8 = (ulong)(ushort)(uVar2 - 6);
      pcVar4 = (code *)(&PTR_get_uint24_00109db0)[uVar8];
      pcVar5 = (code *)(&PTR_get_uint24_00109dc8)[uVar8];
      lVar6 = *(long *)(&DAT_00106a88 + uVar8 * 8);
      puVar7 = mmdb->file_content;
      do {
        lVar14 = uVar13 * uVar2;
        if (mmdb->data_section < puVar7 + (ulong)uVar2 + lVar14) {
          iVar11 = 2;
          goto LAB_00102e9f;
        }
        if (((byte)pcVar15[uVar10 >> 3] >> (~(byte)uVar10 & 7) & 1) == 0) {
          uVar9 = (*pcVar4)();
        }
        else {
          uVar9 = (*pcVar5)(puVar7 + lVar6 + lVar14);
        }
        uVar13 = (ulong)uVar9;
        uVar10 = uVar10 + 1;
      } while ((uVar10 < mmdb->depth) && (uVar9 < uVar3));
    }
    __return_storage_ptr__->netmask = uVar10;
    iVar11 = 2;
    uVar9 = (uint)uVar13;
    if (uVar9 < mmdb->data_section_size + uVar3) {
      if (uVar9 == uVar3) {
        __return_storage_ptr__->found_entry = false;
      }
      else {
        __return_storage_ptr__->found_entry = true;
        (__return_storage_ptr__->entry).offset = (uVar9 - (mmdb->metadata).node_count) - 0x10;
      }
      iVar11 = 0;
    }
  }
LAB_00102e9f:
  *mmdb_error = iVar11;
  return __return_storage_ptr__;
}

Assistant:

MMDB_lookup_result_s MMDB_lookup_sockaddr(const MMDB_s *const mmdb,
                                          const struct sockaddr *const sockaddr,
                                          int *const mmdb_error) {
    MMDB_lookup_result_s result = {.found_entry = false,
                                   .netmask = 0,
                                   .entry = {.mmdb = mmdb, .offset = 0}};

    uint8_t mapped_address[16];
    uint8_t const *address;
    if (mmdb->metadata.ip_version == 4) {
        if (sockaddr->sa_family == AF_INET6) {
            *mmdb_error = MMDB_IPV6_LOOKUP_IN_IPV4_DATABASE_ERROR;
            return result;
        }
        address = (uint8_t const *)&((struct sockaddr_in const *)sockaddr)
                      ->sin_addr.s_addr;
    } else {
        if (sockaddr->sa_family == AF_INET6) {
            address = (uint8_t const *)&((struct sockaddr_in6 const *)sockaddr)
                          ->sin6_addr.s6_addr;
        } else {
            address = mapped_address;
            memset(mapped_address, 0, 12);
            memcpy(mapped_address + 12,
                   &((struct sockaddr_in const *)sockaddr)->sin_addr.s_addr,
                   4);
        }
    }

    *mmdb_error = find_address_in_search_tree(
        mmdb, address, sockaddr->sa_family, &result);

    return result;
}